

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::color4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,color4f *v)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::color4f> local_8c;
  undefined1 local_78 [8];
  optional<tinyusdz::value::color4f> pv_1;
  undefined1 local_4c [8];
  optional<tinyusdz::value::color4f> pv;
  color4f *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (color4f *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00309fcc;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 8),t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 8));
  if (bVar2) {
    get_default_value<tinyusdz::value::color4f>
              ((optional<tinyusdz::value::color4f> *)((long)&pv_1.contained + 0xc),this);
    nonstd::optional_lite::optional<tinyusdz::value::color4f>::optional<tinyusdz::value::color4f,_0>
              ((optional<tinyusdz::value::color4f> *)local_4c,
               (optional<tinyusdz::value::color4f> *)((long)&pv_1.contained + 0xc));
    nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional
              ((optional<tinyusdz::value::color4f> *)((long)&pv_1.contained + 0xc));
    pv_1.contained._8_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c);
    if ((bool)pv_1.contained._8_1_) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::color4f>::value
                         ((optional<tinyusdz::value::color4f> *)local_4c);
      fVar1 = pvVar3->g;
      v->r = pvVar3->r;
      v->g = fVar1;
      fVar1 = pvVar3->a;
      v->b = pvVar3->b;
      v->a = fVar1;
      this_local._7_1_ = 1;
    }
    pv_1.contained._9_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional
              ((optional<tinyusdz::value::color4f> *)local_4c);
    if (pv_1.contained._8_4_ != 0) goto LAB_00309fcc;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00309fcc;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::color4f,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::color4f>(&local_8c,this);
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::
      optional<tinyusdz::value::color4f,_0>
                ((optional<tinyusdz::value::color4f> *)local_78,&local_8c);
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional(&local_8c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_78);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::color4f>::value
                           ((optional<tinyusdz::value::color4f> *)local_78);
        fVar1 = pvVar3->g;
        v->r = pvVar3->r;
        v->g = fVar1;
        fVar1 = pvVar3->a;
        v->b = pvVar3->b;
        v->a = fVar1;
        this_local._7_1_ = 1;
      }
      pv_1.contained._9_3_ = 0;
      pv_1.contained._8_1_ = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional
                ((optional<tinyusdz::value::color4f> *)local_78);
      if (pv_1.contained._8_4_ != 0) goto LAB_00309fcc;
    }
    this_local._7_1_ = 0;
  }
LAB_00309fcc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }